

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simulator.cpp
# Opt level: O0

void __thiscall Simulator::fetch(Simulator *this)

{
  bool bVar1;
  uint32_t uVar2;
  uint uVar3;
  char *pcVar4;
  Simulator *in_RDI;
  bool b_1;
  uint64_t pred_pc;
  int32_t imm;
  uint32_t rd;
  uint32_t rs2;
  uint32_t rs1;
  uint32_t func;
  uint32_t opcode;
  InstSet inst_t;
  uint32_t inst;
  bool b;
  uint64_t pc;
  uint local_ac;
  uint32_t *in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  int local_5c;
  uint64_t local_40;
  uint local_34;
  uint local_30;
  uint local_2c;
  uint local_28;
  uint local_24;
  uint local_20;
  InstSet local_1c;
  ulong local_10;
  
  uVar2 = (uint32_t)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  local_10 = (in_RDI->f_reg).out.pred_pc;
  if ((local_10 & 1) != 0) {
    raiseError(in_RDI,"PC 0x%llx is illegal!\n",local_10);
  }
  if ((in_RDI->e_reg).super_ClockReg<Simulator::ERegX>.out.opcode == 0x67) {
    local_10 = (in_RDI->e_reg).super_ClockReg<Simulator::ERegX>.out.val1 +
               (long)(in_RDI->e_reg).super_ClockReg<Simulator::ERegX>.out.imm & 0xfffffffffffffffe;
  }
  if ((in_RDI->m_reg).super_ClockReg<Simulator::MRegX>.out.opcode == 99) {
    (in_RDI->history).branch_count = (in_RDI->history).branch_count + 1;
    bVar1 = BranchPredictor::predict
                      (in_RDI->branch_predictor,
                       (uint32_t)(in_RDI->m_reg).super_ClockReg<Simulator::MRegX>.out.pc,
                       (long)(in_RDI->m_reg).super_ClockReg<Simulator::MRegX>.out.imm);
    BranchPredictor::update
              (in_RDI->branch_predictor,
               (uint32_t)(in_RDI->m_reg).super_ClockReg<Simulator::MRegX>.out.pc,
               (in_RDI->m_reg).super_ClockReg<Simulator::MRegX>.out.valE != 0);
    if ((ulong)bVar1 == (in_RDI->m_reg).super_ClockReg<Simulator::MRegX>.out.valE) {
      (in_RDI->history).predicted_success = (in_RDI->history).predicted_success + 1;
    }
    else {
      if (bVar1) {
        local_5c = 4;
      }
      else {
        local_5c = (in_RDI->m_reg).super_ClockReg<Simulator::MRegX>.out.imm;
      }
      local_10 = (in_RDI->m_reg).super_ClockReg<Simulator::MRegX>.out.pc + (long)local_5c;
      (in_RDI->history).predicted_unsuccess = (in_RDI->history).predicted_unsuccess + 1;
    }
  }
  uVar2 = MemoryManager::getInt
                    ((MemoryManager *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                     uVar2,in_stack_ffffffffffffff60);
  if ((in_RDI->is_verbose & 1U) != 0) {
    printf("\tINST:%x",(ulong)uVar2);
  }
  local_1c = UNKNOWN;
  local_20 = uVar2 & 0x7f;
  local_24 = uVar2 >> 0xc & 7;
  local_28 = uVar2 >> 0xf & 0x1f;
  local_2c = uVar2 >> 0x14 & 0x1f;
  local_30 = uVar2 >> 7 & 0x1f;
  local_34 = 0;
  if (uVar2 == 0) {
    local_20 = 0;
  }
  if (local_20 < 0x74) {
    uVar3 = (int)uVar2 >> 0x14;
    switch(local_20) {
    case 0:
      break;
    default:
      goto switchD_0010f5a7_caseD_1;
    case 3:
      switch(local_24) {
      case 0:
        local_1c = LB;
        break;
      case 1:
        local_1c = LH;
        break;
      case 2:
        local_1c = LW;
        break;
      case 3:
        local_1c = LD;
        break;
      case 4:
        local_1c = LBU;
        break;
      case 5:
        local_1c = LHU;
        break;
      case 6:
        local_1c = LWU;
        break;
      default:
        raiseError(in_RDI,"Invaild LOAD Instruction at %x, The Func Field %x is invaild\n",local_10,
                   (ulong)local_24);
      }
      local_2c = 0;
      local_34 = uVar3;
      break;
    case 0x13:
      switch(local_24) {
      case 0:
        local_1c = ADDI;
        break;
      case 1:
        local_1c = SLLI;
        break;
      case 2:
        local_1c = SLTI;
        break;
      case 3:
        local_1c = SLTIU;
        break;
      case 4:
        local_1c = XORI;
        break;
      case 5:
        if (uVar2 >> 0x1a == 0) {
          local_1c = SRLI;
        }
        else if (uVar2 >> 0x1a == 0x10) {
          local_1c = SRAI;
        }
        else {
          raiseError(in_RDI,
                     "Invaild RI Instruction at %x, The Func3 field is %x, The Func7 Field %x is invaild\n"
                     ,local_10,(ulong)(uVar2 >> 0x1a),(ulong)local_24);
        }
        break;
      case 6:
        local_1c = ORI;
        break;
      case 7:
        local_1c = ANDI;
        break;
      default:
        raiseError(in_RDI,"Invaild RI Instruction at %x, The Func Field %x is invaild\n",local_10,
                   (ulong)local_24);
      }
      local_2c = 0;
      local_34 = uVar3;
      break;
    case 0x17:
      local_1c = AUIPC;
      local_2c = 0;
      local_28 = 0;
      local_24 = 0;
      local_34 = ((int)uVar2 >> 0xc) << 0xc;
      break;
    case 0x1b:
      if (local_24 == 0) {
        local_1c = ADDIW;
      }
      else if (local_24 == 1) {
        local_1c = SLLIW;
      }
      else if (local_24 == 5) {
        if (uVar2 >> 0x1e == 1) {
          local_1c = SRAIW;
        }
        else if (uVar2 >> 0x1e == 0) {
          local_1c = SRLIW;
        }
        else {
          raiseError(in_RDI,"Invaild RIW Instruction at %x, The Func Field %x is invaild\n",local_10
                     ,5);
        }
      }
      else {
        raiseError(in_RDI,"Invaild RIW Instruction at %x, The Func Field %x is invaild\n",local_10,
                   (ulong)local_24);
      }
      local_2c = 0;
      local_34 = uVar3;
      break;
    case 0x23:
      switch(local_24) {
      case 0:
        local_1c = SB;
        break;
      case 1:
        local_1c = SH;
        break;
      case 2:
        local_1c = SW;
        break;
      case 3:
        local_1c = SD;
        break;
      default:
        raiseError(in_RDI,"Invaild STORE Instruction at %x, The Func Field %x is invaild\n",local_10
                   ,(ulong)local_24);
      }
      local_30 = 0;
      local_34 = (int)((uVar2 >> 7 & 0x1f | (uVar2 >> 0x19) << 5) << 0x14) >> 0x14;
      break;
    case 0x33:
      switch(local_24) {
      case 0:
        if (uVar2 >> 0x19 == 0) {
          local_1c = ADD;
        }
        else if (uVar2 >> 0x19 == 1) {
          local_1c = MUL;
        }
        else if (uVar2 >> 0x19 == 0x20) {
          local_1c = SUB;
        }
        else {
          raiseError(in_RDI,
                     "Invaild RR Instruction at %x, The Func7 field is %x, The Func3 Field %x is invaild\n"
                     ,local_10,(ulong)(uVar2 >> 0x19),(ulong)local_24);
        }
        break;
      case 1:
        if (uVar2 >> 0x19 == 0) {
          local_1c = SLL;
        }
        else if (uVar2 >> 0x19 == 1) {
          local_1c = MULH;
        }
        else {
          raiseError(in_RDI,
                     "Invaild RR Instruction at %x, The Func7 field is %x, The Func3 Field %x is invaild\n"
                     ,local_10,(ulong)(uVar2 >> 0x19),(ulong)local_24);
        }
        break;
      case 2:
        if (uVar2 >> 0x19 == 0) {
          local_1c = SLT;
        }
        else if (uVar2 >> 0x19 == 1) {
          local_1c = MULHSU;
        }
        else {
          raiseError(in_RDI,
                     "Invaild RR Instruction at %x, The Func7 field is %x, The Func3 Field %x is invaild\n"
                     ,local_10,(ulong)(uVar2 >> 0x19),(ulong)local_24);
        }
        break;
      case 3:
        if (uVar2 >> 0x19 == 0) {
          local_1c = SLTU;
        }
        else if (uVar2 >> 0x19 == 1) {
          local_1c = MULHU;
        }
        else {
          raiseError(in_RDI,
                     "Invaild RR Instruction at %x, The Func7 field is %x, The Func3 Field %x is invaild\n"
                     ,local_10,(ulong)(uVar2 >> 0x19),(ulong)local_24);
        }
        break;
      case 4:
        if (uVar2 >> 0x19 == 0) {
          local_1c = XOR;
        }
        else if (uVar2 >> 0x19 == 1) {
          local_1c = DIV;
        }
        else {
          raiseError(in_RDI,
                     "Invaild RR Instruction at %x, The Func7 field is %x, The Func3 Field %x is invaild\n"
                     ,local_10,(ulong)(uVar2 >> 0x19),(ulong)local_24);
        }
        break;
      case 5:
        if (uVar2 >> 0x19 == 0) {
          local_1c = SRL;
        }
        else if (uVar2 >> 0x19 == 0x20) {
          local_1c = SRA;
        }
        else if (uVar2 >> 0x19 == 1) {
          local_1c = DIVU;
        }
        else {
          raiseError(in_RDI,
                     "Invaild RR Instruction at %x, The Func7 field is %x, The Func3 Field %x is invaild\n"
                     ,local_10,(ulong)(uVar2 >> 0x19),(ulong)local_24);
        }
        break;
      case 6:
        if (uVar2 >> 0x19 == 0) {
          local_1c = OR;
        }
        else if (uVar2 >> 0x19 == 1) {
          local_1c = REM;
        }
        else {
          raiseError(in_RDI,
                     "Invaild RR Instruction at %x, The Func7 field is %x, The Func3 Field %x is invaild\n"
                     ,local_10,(ulong)(uVar2 >> 0x19),(ulong)local_24);
        }
        break;
      case 7:
        if (uVar2 >> 0x19 == 0) {
          local_1c = AND;
        }
        else if (uVar2 >> 0x19 == 1) {
          local_1c = REMU;
        }
        else {
          raiseError(in_RDI,
                     "Invaild RR Instruction at %x, The Func7 field is %x, The Func3 Field %x is invaild\n"
                     ,local_10,(ulong)(uVar2 >> 0x19),(ulong)local_24);
        }
        break;
      default:
        raiseError(in_RDI,"Invaild RR Instruction at %x, The Func3 Field %x is invaild\n",local_10,
                   (ulong)local_24);
      }
      local_24 = (uVar2 >> 0x19) << 3 | local_24;
      break;
    case 0x37:
      local_1c = LUI;
      local_2c = 0;
      local_28 = 0;
      local_24 = 0;
      local_34 = ((int)uVar2 >> 0xc) << 0xc;
      break;
    case 0x3b:
      switch(local_24) {
      case 0:
        if (uVar2 >> 0x19 == 0) {
          local_1c = ADDW;
        }
        else if (uVar2 >> 0x19 == 1) {
          local_1c = MULW;
        }
        else if (uVar2 >> 0x19 == 0x20) {
          local_1c = SUBW;
        }
        else {
          raiseError(in_RDI,
                     "Invaild RRW Instruction at %x, The Func7 field is %x, The Func3 Field %x is invaild\n"
                     ,local_10,(ulong)(uVar2 >> 0x19),(ulong)local_24);
        }
        break;
      case 1:
        local_1c = SLLW;
        break;
      default:
        raiseError(in_RDI,
                   "Invaild RRW Instruction at %x, The Func7 field is %x, The Func3 Field %x is invaild\n"
                   ,local_10,(ulong)(uVar2 >> 0x19),(ulong)local_24);
        break;
      case 4:
        local_1c = DIVW;
        break;
      case 5:
        if (uVar2 >> 0x19 == 0) {
          local_1c = SRLW;
        }
        else if (uVar2 >> 0x19 == 0x20) {
          local_1c = SRAW;
        }
        else if (uVar2 >> 0x19 == 1) {
          local_1c = DIVUW;
        }
        else {
          raiseError(in_RDI,
                     "Invaild RRW Instruction at %x, The Func7 field is %x, The Func3 Field %x is invaild\n"
                     ,local_10,(ulong)(uVar2 >> 0x19),(ulong)local_24);
        }
        break;
      case 6:
        if (uVar2 >> 0x19 == 1) {
          local_1c = REMW;
        }
        else {
          raiseError(in_RDI,
                     "Invaild RRW Instruction at %x, The Func7 field is %x, The Func3 Field %x is invaild\n"
                     ,local_10,(ulong)(uVar2 >> 0x19),(ulong)local_24);
        }
        break;
      case 7:
        if (uVar2 >> 0x19 == 1) {
          local_1c = REMUW;
        }
        else {
          raiseError(in_RDI,
                     "Invaild RRW Instruction at %x, The Func7 field is %x, The Func3 Field %x is invaild\n"
                     ,local_10,(ulong)(uVar2 >> 0x19),(ulong)local_24);
        }
      }
      local_24 = (uVar2 >> 0x19) << 3 | local_24;
      break;
    case 99:
      switch(local_24) {
      case 0:
        local_1c = BEQ;
        break;
      case 1:
        local_1c = BNE;
        break;
      default:
        raiseError(in_RDI,"Invaild BRANCH Instruction at %x, The Func Field %x is invaild\n",
                   local_10,(ulong)local_24);
        break;
      case 4:
        local_1c = BLT;
        break;
      case 5:
        local_1c = BGE;
        break;
      case 6:
        local_1c = BLTU;
        break;
      case 7:
        local_1c = BGEU;
      }
      local_30 = 0;
      local_34 = (int)(((uVar2 >> 8 & 0xf) << 1 | (uVar2 >> 0x19 & 0x3f) << 5 |
                        (uVar2 >> 7 & 1) << 0xb | (uVar2 >> 0x1f) << 0xc) << 0x13) >> 0x13;
      if ((in_RDI->is_verbose & 1U) != 0) {
        printf("\timm:%x",(ulong)local_34);
      }
      break;
    case 0x67:
      local_1c = JALR;
      local_2c = 0;
      local_34 = uVar3;
      break;
    case 0x6f:
      local_1c = JAL;
      local_2c = 0;
      local_28 = 0;
      local_24 = 0;
      local_34 = (int)(((uVar2 >> 0x15 & 0x3ff) << 1 | (uVar2 >> 0x14 & 1) << 0xb |
                        (uVar2 >> 0xc & 0xff) << 0xc | (uVar2 >> 0x1f) << 0x14) << 0xb) >> 0xb;
      break;
    case 0x73:
      local_24 = 0;
      local_28 = 10;
      local_30 = 10;
      local_2c = 0x11;
      local_1c = ECALL;
    }
  }
  else {
switchD_0010f5a7_caseD_1:
    raiseError(in_RDI,"Invaild Instruction %x at %x\n",(ulong)uVar2,local_10);
  }
  if ((in_RDI->is_verbose & 1U) != 0) {
    printf("\tIF: %s",*(undefined8 *)(RISCV_GRX::INSTNAME + (ulong)local_1c * 8));
    printf("\tpc: %lx",local_10);
  }
  if (local_20 == 0x6f) {
    (in_RDI->history).jal_count = (in_RDI->history).jal_count + 1;
    local_40 = local_10 + (long)(int)local_34;
  }
  else if (local_20 == 99) {
    bVar1 = BranchPredictor::predict
                      (in_RDI->branch_predictor,(uint32_t)local_10,(long)(int)local_34);
    if ((in_RDI->is_verbose & 1U) != 0) {
      pcVar4 = "not";
      if (bVar1) {
        pcVar4 = "";
      }
      printf("Predict: branch %staken.\n",pcVar4);
    }
    if (bVar1) {
      local_ac = local_34;
    }
    else {
      local_ac = 4;
    }
    local_40 = local_10 + (long)(int)local_ac;
  }
  else {
    local_40 = local_10 + 4;
  }
  if ((in_RDI->is_verbose & 1U) != 0) {
    printf("\tpred_pc: %lx\n",local_40);
  }
  (in_RDI->f_reg).in.pred_pc = local_40;
  (in_RDI->d_reg).super_ClockReg<Simulator::DRegX>.in.opcode = local_20;
  (in_RDI->d_reg).super_ClockReg<Simulator::DRegX>.in.func = local_24;
  (in_RDI->d_reg).super_ClockReg<Simulator::DRegX>.in.rs1 = local_28;
  (in_RDI->d_reg).super_ClockReg<Simulator::DRegX>.in.rs2 = local_2c;
  (in_RDI->d_reg).super_ClockReg<Simulator::DRegX>.in.rd = local_30;
  (in_RDI->d_reg).super_ClockReg<Simulator::DRegX>.in.imm = local_34;
  (in_RDI->d_reg).super_ClockReg<Simulator::DRegX>.in.pc = local_10;
  (in_RDI->d_reg).super_ClockReg<Simulator::DRegX>.in.inst = local_1c;
  if ((in_RDI->is_verbose & 1U) != 0) {
    printf("Fetch instruction 0x%x at 0x%lx\n",(ulong)uVar2,local_10);
  }
  return;
}

Assistant:

void Simulator::fetch() {
//    if (e_reg.out.stall_count != 0)
//        return;
    uint64_t pc = f_reg.out.pred_pc;
    if (pc % 2 != 0) {
        this->raiseError("PC 0x%llx is illegal!\n", pc);
    }
    if (e_reg.out.opcode == OP_JALR) {
        pc = (uint64_t) (e_reg.out.val1 + e_reg.out.imm) & ~1LLu;
    }

    if (m_reg.out.opcode == OP_BRANCH) {
        history.branch_count++;
        bool b = branch_predictor->predict(m_reg.out.pc, m_reg.out.imm);
        branch_predictor->update(m_reg.out.pc, m_reg.out.valE);
        if (b ^ m_reg.out.valE) {
            pc = m_reg.out.pc + (b ? 4 : m_reg.out.imm);
            history.predicted_unsuccess++;
        } else {
            history.predicted_success++;
        }
    }

    uint32_t inst = memory->getInt(pc);
    if (is_verbose) {
        printf("\tINST:%x", inst);
    }
    InstSet inst_t = UNKNOWN;

    uint32_t opcode = inst & 0x7fu;
    uint32_t func = (inst >> 12u) & 0x7u;
    uint32_t rs1 = (inst >> 15u) & 0x1fu;
    uint32_t rs2 = (inst >> 20u) & 0x1fu;
    uint32_t rd = (inst >> 7u) & 0x1fu;
    int32_t imm = 0;
    //uint32_t stall_count = 1;

    if (inst == 0) {
        opcode = OP_BUBBLE;
    }

    switch (opcode) {
        case OP_ECALL:
            func = 0;
            rs1 = REG_A0;
            //rd = REG_A5;
            rd = REG_A0;
            rs2 = REG_A7;
            inst_t = ECALL;
            //stall_count = CALU_BIT;
            break;
        case OP_RR: {
            // R-Type
            switch (func) {
                case 0x0:
                    if (inst >> 25u == 0x00) {
                        //stall_count = CALU_ADD;
                        inst_t = ADD;
                    } else if (inst >> 25u == 0x01) {
                        //stall_count = CALU_MUL;
                        inst_t = MUL;
                    } else if (inst >> 25u == 0x20) {
                        //stall_count = CALU_ADD;
                        inst_t = SUB;
                    } else
                        raiseError(
                                "Invaild RR Instruction at %x, The Func7 field is %x, The Func3 Field %x is invaild\n",
                                pc, inst >> 25u, func);
                    break;
                case 0x1:
                    if (inst >> 25u == 0x00) {
                        //stall_count = CALU_BIT;
                        inst_t = SLL;
                    } else if (inst >> 25u == 0x01) {
                        //stall_count = CALU_MUL;
                        inst_t = MULH;
                    } else
                        raiseError(
                                "Invaild RR Instruction at %x, The Func7 field is %x, The Func3 Field %x is invaild\n",
                                pc, inst >> 25u, func);
                    break;
                case 0x2:
                    if (inst >> 25u == 0x00) {
                        //stall_count = CALU_BIT;
                        inst_t = SLT;
                    } else if (inst >> 25u == 0x01) {
                        //stall_count = CALU_MUL;
                        inst_t = MULHSU;
                    } else
                        raiseError(
                                "Invaild RR Instruction at %x, The Func7 field is %x, The Func3 Field %x is invaild\n",
                                pc, inst >> 25u, func);
                    break;
                case 0x3:
                    if (inst >> 25u == 0x00) {
                        //stall_count = CALU_BIT;
                        inst_t = SLTU;
                    } else if (inst >> 25u == 0x01) {
                        //stall_count = CALU_MUL;
                        inst_t = MULHU;
                    } else
                        raiseError(
                                "Invaild RR Instruction at %x, The Func7 field is %x, The Func3 Field %x is invaild\n",
                                pc, inst >> 25u, func);
                    break;
                case 0x4:
                    if (inst >> 25u == 0x00) {
                        //stall_count = CALU_BIT;
                        inst_t = XOR;
                    } else if (inst >> 25u == 0x01) {
                        //stall_count = CALU_DIV;
                        inst_t = DIV;
                    } else
                        this->raiseError(
                                "Invaild RR Instruction at %x, The Func7 field is %x, The Func3 Field %x is invaild\n",
                                pc, inst >> 25u, func);
                    break;
                case 0x5:
                    if (inst >> 25u == 0x00) {
                        //stall_count = CALU_BIT;
                        inst_t = SRL;
                    } else if (inst >> 25u == 0x20) {
                        //stall_count = CALU_BIT;
                        inst_t = SRA;
                    } else if (inst >> 25u == 0x01) {
                        //stall_count = CALU_DIV;
                        inst_t = DIVU;
                    } else
                        this->raiseError(
                                "Invaild RR Instruction at %x, The Func7 field is %x, The Func3 Field %x is invaild\n",
                                pc, inst >> 25u, func);
                    break;
                case 0x6:
                    if (inst >> 25u == 0x00) {
                        //stall_count = CALU_BIT;
                        inst_t = OR;
                    } else if (inst >> 25u == 0x01) {
                        //stall_count = CALU_DIV;
                        inst_t = REM;
                    } else
                        this->raiseError(
                                "Invaild RR Instruction at %x, The Func7 field is %x, The Func3 Field %x is invaild\n",
                                pc, inst >> 25u, func);
                    break;
                case 0x7:
                    if (inst >> 25u == 0x00) {
                        //stall_count = CALU_BIT;
                        inst_t = AND;
                    } else if (inst >> 25u == 0x01) {
                        //stall_count = CALU_DIV;
                        inst_t = REMU;
                    } else
                        this->raiseError(
                                "Invaild RR Instruction at %x, The Func7 field is %x, The Func3 Field %x is invaild\n",
                                pc, inst >> 25u, func);
                    break;
                default:
                    this->raiseError("Invaild RR Instruction at %x, The Func3 Field %x is invaild\n", pc, func);
                    break;
            }
            func |= inst >> 25u << 3u;
            break;
        }
        case OP_32: {
            switch (func) {
                case 0x0:
                    if (inst >> 25u == 0x00) {
                        //stall_count = CALU_ADD;
                        inst_t = ADDW;
                    } else if (inst >> 25u == 0x01) {
                        //stall_count = CALU_MUL_32;
                        inst_t = MULW;
                    } else if (inst >> 25u == 0x20) {
                        //stall_count = CALU_ADD;
                        inst_t = SUBW;
                    } else
                        this->raiseError(
                                "Invaild RRW Instruction at %x, The Func7 field is %x, The Func3 Field %x is invaild\n",
                                pc, inst >> 25u, func);
                    break;
                case 0x1:
                    //stall_count = CALU_BIT;
                    inst_t = SLLW;
                    break;
                case 0x4:
                    //stall_count = CALU_DIV_32;
                    inst_t = DIVW;
                    break;
                case 0x5:
                    if (inst >> 25u == 0x00) {
                        //stall_count = CALU_BIT;
                        inst_t = SRLW;
                    } else if (inst >> 25u == 0x20) {
                        //stall_count = CALU_BIT;
                        inst_t = SRAW;
                    } else if (inst >> 25u == 0x01) {
                        //stall_count = CALU_DIV_32;
                        inst_t = DIVUW;
                    } else
                        raiseError(
                                "Invaild RRW Instruction at %x, The Func7 field is %x, The Func3 Field %x is invaild\n",
                                pc, inst >> 25u, func);
                    break;
                case 0x6:
                    if (inst >> 25u == 0x01) {
                        //stall_count = CALU_DIV_32;
                        inst_t = REMW;
                    } else
                        raiseError(
                                "Invaild RRW Instruction at %x, The Func7 field is %x, The Func3 Field %x is invaild\n",
                                pc, inst >> 25u, func);
                    break;
                case 0x7:
                    if (inst >> 25u == 0x01) {
                        //stall_count = CALU_DIV_32;
                        inst_t = REMUW;
                    } else
                        raiseError(
                                "Invaild RRW Instruction at %x, The Func7 field is %x, The Func3 Field %x is invaild\n",
                                pc, inst >> 25u, func);
                    break;
                default:
                    raiseError("Invaild RRW Instruction at %x, The Func7 field is %x, The Func3 Field %x is invaild\n",
                               pc, inst >> 25u, func);
                    break;
            }
            func |= inst >> 25u << 3u;
            break;
        }
        case OP_JALR: // I-Type
            //stall_count = CALU_ADD;
            inst_t = JALR;
            rs2 = 0;
            imm = (int) inst >> 20u;
            break;
        case OP_LOAD:
            //stall_count = CALU_ADD;
            switch (func) {
                case 0x0:
                    inst_t = LB;
                    break;
                case 0x1:
                    inst_t = LH;
                    break;
                case 0x2:
                    inst_t = LW;
                    break;
                case 0x3:
                    inst_t = LD;
                    break;
                case 0x4:
                    inst_t = LBU;
                    break;
                case 0x5:
                    inst_t = LHU;
                    break;
                case 0x6:
                    inst_t = LWU;
                    break;
                default:
                    this->raiseError("Invaild LOAD Instruction at %x, The Func Field %x is invaild\n", pc, func);
                    break;
            }
            rs2 = 0;
            imm = (int) inst >> 20;
            break;
        case OP_IMM:
            switch (func) {
                case 0x0:
                    //stall_count = CALU_ADD;
                    inst_t = ADDI;
                    break;
                case 0x1:
                    //stall_count = CALU_BIT;
                    inst_t = SLLI;
                    break;
                case 0x2:
                    //stall_count = CALU_BIT;
                    inst_t = SLTI;
                    break;
                case 0x3:
                    //stall_count = CALU_BIT;
                    inst_t = SLTIU;
                    break;
                case 0x4:
                    //stall_count = CALU_BIT;
                    inst_t = XORI;
                    break;
                case 0x5: {
                    switch (inst >> 26u) {
                        case 0x00:
                            //stall_count = CALU_BIT;
                            inst_t = SRLI;
                            break;
                        case 0x10:
                            //stall_count = CALU_BIT;
                            inst_t = SRAI;
                            break;
                        default:
                            this->raiseError(
                                    "Invaild RI Instruction at %x, The Func3 field is %x, The Func7 Field %x is invaild\n",
                                    pc, inst >> 26u, func);
                            break;
                    }
                    break;
                }
                case 0x6:
                    //stall_count = CALU_BIT;
                    inst_t = ORI;
                    break;
                case 0x7:
                    //stall_count = CALU_BIT;
                    inst_t = ANDI;
                    break;
                default:
                    this->raiseError("Invaild RI Instruction at %x, The Func Field %x is invaild\n", pc, func);
                    break;
            }
            rs2 = 0;
            imm = (int) inst >> 20u;
            break;
        case OP_IMM_32:
            switch (func) {
                case 0x0:
                    //stall_count = CALU_ADD;
                    inst_t = ADDIW;
                    break;
                case 0x1:
                    //stall_count = CALU_BIT;
                    inst_t = SLLIW;
                    break;
                case 0x5:
                    if (inst >> 30u == 1) {
                        //stall_count = CALU_BIT;
                        inst_t = SRAIW;
                    } else if (inst >> 30u == 0) {
                        //stall_count = CALU_BIT;
                        inst_t = SRLIW;
                    } else {
                        this->raiseError("Invaild RIW Instruction at %x, The Func Field %x is invaild\n", pc, func);
                    }
                    break;
                default:
                    this->raiseError("Invaild RIW Instruction at %x, The Func Field %x is invaild\n", pc, func);
                    break;
            }
            rs2 = 0;
            imm = (int) inst >> 20;
            //is this right?
            break;
        case OP_STORE: // S-Type
            //stall_count = CALU_ADD;
            switch (func) {
                case 0x0:
                    inst_t = SB;
                    break;
                case 0x1:
                    inst_t = SH;
                    break;
                case 0x2:
                    inst_t = SW;
                    break;
                case 0x3:
                    inst_t = SD;
                    break;
                default:
                    this->raiseError("Invaild STORE Instruction at %x, The Func Field %x is invaild\n", pc, func);
                    break;
            }
            rd = 0;
            imm = (inst >> 7u & 0x1fu) | inst >> 25u << 5u;
            imm = (int) imm << 20 >> 20;
            // is this right?
            break;
        case OP_BRANCH://SB-Type
            //stall_count = CALU_BIT;
            switch (func) {
                case 0x0:
                    inst_t = BEQ;
                    break;
                case 0x1:
                    inst_t = BNE;
                    break;
                case 0x4:
                    inst_t = BLT;
                    break;
                case 0x5:
                    inst_t = BGE;
                    break;
                case 0x6:
                    inst_t = BLTU;
                    break;
                case 0x7:
                    inst_t = BGEU;
                    break;
                default:
                    this->raiseError("Invaild BRANCH Instruction at %x, The Func Field %x is invaild\n", pc, func);
                    break;
            }
            rd = 0;
            imm = (inst >> 8u & 0xfu) << 1u | (inst >> 25u & 0x3fu) << 5u | (inst >> 7u & 0x1u) << 11u |
                  inst >> 31u << 12u;
            imm = (int) imm << 19u >> 19u;
            if (is_verbose) {
                printf("\timm:%x", imm);
            }
            // is this right?
            break;
        case OP_LUI://U-Type
            inst_t = LUI;
            //stall_count = CALU_BIT;
            func = rs1 = rs2 = 0;
            imm = (int) inst >> 12u << 12u;
            //is this right?
            break;
        case OP_AUIPC:
            inst_t = AUIPC;
            //stall_count = CALU_ADD;
            func = rs1 = rs2 = 0;
            imm = (int) inst >> 12u << 12u;
            // is this right?
            break;
        case OP_JAL://UJ-Type
            //stall_count = CALU_ADD;
            inst_t = JAL;
            func = rs1 = rs2 = 0;
            imm = (inst >> 21u & 0x3ffu) << 1u | (inst >> 20u & 1u) << 11u | (inst >> 12u & 0xffu) << 12u |
                  inst >> 31u << 20u;
            imm = (int) imm << 11u >> 11u;
            // is this right?
            break;
        case OP_BUBBLE:
            break;
        default:
            this->raiseError("Invaild Instruction %x at %x\n", inst, pc);
            break;

    }
    if (is_verbose) {
        printf("\tIF: %s", INSTNAME[inst_t]);
        printf("\tpc: %lx", pc);
    }
    uint64_t pred_pc;
    if (opcode == OP_JAL) {
        history.jal_count++;
        pred_pc = pc + imm;
    } else if (opcode == OP_BRANCH) {
        bool b = branch_predictor->predict(pc, imm);
        if (is_verbose) {
            printf("Predict: branch %staken.\n", b ? "" : "not");
        }
        pred_pc = pc + (b ? imm : 4);
    } else {
        pred_pc = pc + 4;
    }
    if (is_verbose) {
        printf("\tpred_pc: %lx\n", pred_pc);
    }
    f_reg.in.pred_pc = pred_pc;

    //d_reg.in.stall_count = stall_count;
    d_reg.in.opcode = opcode;
    d_reg.in.func = func;
    d_reg.in.rs1 = rs1;
    d_reg.in.rs2 = rs2;
    d_reg.in.rd = rd;
    d_reg.in.imm = imm;
    d_reg.in.pc = pc;
    d_reg.in.inst = inst_t;

    if (this->is_verbose) {
        printf("Fetch instruction 0x%x at 0x%lx\n", inst, pc);
    }
}